

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

void __thiscall
bench::save_stats(bench *this,ostream *os,string *name,
                 vector<bench::element,_std::allocator<bench::element>_> *c)

{
  allocator<result> *this_00;
  size_t sVar1;
  string *psVar2;
  objective_function_type type;
  size_type sVar3;
  double *pdVar4;
  reference pvVar5;
  const_reference pvVar6;
  reference pvVar7;
  size_type sVar8;
  iterator iVar9;
  iterator iVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar13 [16];
  undefined1 in_ZMM1 [64];
  size_t e_2;
  size_t i_2;
  size_t e_1;
  size_t i_1;
  size_t rank;
  size_t end_j_4;
  size_t j_4;
  size_t end_j_3;
  size_t j_3;
  result *local_130;
  result *local_128;
  size_type local_120;
  size_t end_j_2;
  size_t j_2;
  size_t end_j_1;
  size_t j_1;
  size_t rank_1;
  __normal_iterator<result_*,_std::vector<result,_std::allocator<result>_>_> local_f0;
  undefined1 local_e8 [16];
  size_t local_d8;
  result local_d0;
  size_type local_b8;
  size_t end_j;
  size_t j;
  size_t e;
  size_t i;
  undefined1 local_90 [8];
  vector<result,_std::allocator<result>_> line;
  undefined1 local_70 [8];
  vector<result,_std::allocator<result>_> stats;
  string local_48;
  vector<bench::element,_std::allocator<bench::element>_> *local_28;
  vector<bench::element,_std::allocator<bench::element>_> *c_local;
  string *name_local;
  ostream *os_local;
  bench *this_local;
  
  local_28 = c;
  c_local = (vector<bench::element,_std::allocator<bench::element>_> *)name;
  name_local = (string *)os;
  os_local = (ostream *)this;
  std::__cxx11::string::string((string *)&local_48,name);
  save_header(this,os,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  sVar3 = std::vector<bench::solver,_std::allocator<bench::solver>_>::size(&this->solvers);
  this_00 = (allocator<result> *)
            ((long)&line.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<result>::allocator(this_00);
  std::vector<result,_std::allocator<result>_>::vector
            ((vector<result,_std::allocator<result>_> *)local_70,sVar3 + 1,this_00);
  std::allocator<result>::~allocator
            ((allocator<result> *)
             ((long)&line.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  sVar3 = std::vector<bench::solver,_std::allocator<bench::solver>_>::size(&this->solvers);
  std::allocator<result>::allocator((allocator<result> *)((long)&i + 7));
  std::vector<result,_std::allocator<result>_>::vector
            ((vector<result,_std::allocator<result>_> *)local_90,sVar3 + 1,
             (allocator<result> *)((long)&i + 7));
  std::allocator<result>::~allocator((allocator<result> *)((long)&i + 7));
  e = 0;
  j = std::vector<bench::model,_std::allocator<bench::model>_>::size(&this->models);
  for (; e != j; e = e + 1) {
    end_j = 0;
    local_b8 = std::vector<result,_std::allocator<result>_>::size
                         ((vector<result,_std::allocator<result>_> *)local_90);
    for (; end_j != local_b8; end_j = end_j + 1) {
      pdVar4 = baryonyx::dynamic_array<double>::operator()(&this->array,e,end_j);
      ::result::result(&local_d0,*pdVar4,end_j);
      pvVar5 = std::vector<result,_std::allocator<result>_>::operator[]
                         ((vector<result,_std::allocator<result>_> *)local_90,end_j);
      pvVar5->value = local_d0.value;
      pvVar5->position = local_d0.position;
      pvVar5->rank = local_d0.rank;
    }
    pvVar6 = std::vector<bench::element,_std::allocator<bench::element>_>::operator[](local_28,e);
    dVar11 = pvVar6->solution;
    sVar3 = std::vector<bench::solver,_std::allocator<bench::solver>_>::size(&this->solvers);
    ::result::result((result *)local_e8,dVar11,sVar3);
    sVar3 = std::vector<bench::solver,_std::allocator<bench::solver>_>::size(&this->solvers);
    pvVar5 = std::vector<result,_std::allocator<result>_>::operator[]
                       ((vector<result,_std::allocator<result>_> *)local_90,sVar3);
    pvVar5->rank = local_d8;
    in_ZMM0 = ZEXT1664(local_e8);
    pvVar5->value = (double)local_e8._0_8_;
    pvVar5->position = local_e8._8_8_;
    local_f0._M_current =
         (result *)
         std::begin<std::vector<result,std::allocator<result>>>
                   ((vector<result,_std::allocator<result>_> *)local_90);
    rank_1 = (size_t)std::end<std::vector<result,std::allocator<result>>>
                               ((vector<result,_std::allocator<result>_> *)local_90);
    pvVar7 = std::vector<bench::model,_std::allocator<bench::model>_>::operator[](&this->models,e);
    type = model::objective_type(pvVar7);
    sort_on_value<__gnu_cxx::__normal_iterator<result*,std::vector<result,std::allocator<result>>>>
              (local_f0,(__normal_iterator<result_*,_std::vector<result,_std::allocator<result>_>_>)
                        rank_1,type);
    j_1 = 1;
    pvVar5 = std::vector<result,_std::allocator<result>_>::operator[]
                       ((vector<result,_std::allocator<result>_> *)local_90,0);
    pvVar5->rank = 1;
    end_j_1 = 1;
    j_2 = std::vector<result,_std::allocator<result>_>::size
                    ((vector<result,_std::allocator<result>_> *)local_90);
    for (; end_j_1 != j_2; end_j_1 = end_j_1 + 1) {
      pvVar5 = std::vector<result,_std::allocator<result>_>::operator[]
                         ((vector<result,_std::allocator<result>_> *)local_90,end_j_1);
      dVar11 = pvVar5->value;
      pvVar5 = std::vector<result,_std::allocator<result>_>::operator[]
                         ((vector<result,_std::allocator<result>_> *)local_90,end_j_1 - 1);
      in_ZMM0 = ZEXT864((ulong)dVar11);
      if ((dVar11 != pvVar5->value) || (NAN(dVar11) || NAN(pvVar5->value))) {
        j_1 = j_1 + 1;
      }
      sVar1 = j_1;
      pvVar5 = std::vector<result,_std::allocator<result>_>::operator[]
                         ((vector<result,_std::allocator<result>_> *)local_90,end_j_1);
      pvVar5->rank = sVar1;
    }
    end_j_2 = 0;
    local_120 = std::vector<result,_std::allocator<result>_>::size
                          ((vector<result,_std::allocator<result>_> *)local_90);
    for (; end_j_2 != local_120; end_j_2 = end_j_2 + 1) {
      pvVar5 = std::vector<result,_std::allocator<result>_>::operator[]
                         ((vector<result,_std::allocator<result>_> *)local_90,end_j_2);
      sVar1 = pvVar5->rank;
      pvVar5 = std::vector<result,_std::allocator<result>_>::operator[]
                         ((vector<result,_std::allocator<result>_> *)local_90,end_j_2);
      pvVar5 = std::vector<result,_std::allocator<result>_>::operator[]
                         ((vector<result,_std::allocator<result>_> *)local_70,pvVar5->position);
      pvVar5->rank = sVar1 + pvVar5->rank;
    }
    local_128 = (result *)
                std::begin<std::vector<result,std::allocator<result>>>
                          ((vector<result,_std::allocator<result>_> *)local_90);
    local_130 = (result *)
                std::end<std::vector<result,std::allocator<result>>>
                          ((vector<result,_std::allocator<result>_> *)local_90);
    std::
    sort<__gnu_cxx::__normal_iterator<result*,std::vector<result,std::allocator<result>>>,bench::save_stats(std::ostream&,std::__cxx11::string,std::vector<bench::element,std::allocator<bench::element>>const&)::_lambda(auto:1_const&,auto:2_const&)_1_>
              (local_128,local_130);
    psVar2 = name_local;
    pvVar7 = std::vector<bench::model,_std::allocator<bench::model>_>::operator[](&this->models,e);
    _j_3 = model::name(pvVar7);
    ::fmt::v7::print<char[3],std::basic_string_view<char,std::char_traits<char>>,char>
              ((basic_ostream<char,_std::char_traits<char>_> *)psVar2,(char (*) [3])0xc9d135,
               (basic_string_view<char,_std::char_traits<char>_> *)&j_3);
    end_j_3 = 0;
    sVar3 = std::vector<result,_std::allocator<result>_>::size
                      ((vector<result,_std::allocator<result>_> *)local_90);
    for (; psVar2 = name_local, end_j_3 != sVar3; end_j_3 = end_j_3 + 1) {
      pvVar5 = std::vector<result,_std::allocator<result>_>::operator[]
                         ((vector<result,_std::allocator<result>_> *)local_90,end_j_3);
      ::fmt::v7::print<char[4],unsigned_long&,char>
                ((basic_ostream<char,_std::char_traits<char>_> *)psVar2,(char (*) [4])",{}",
                 &pvVar5->rank);
    }
    ::fmt::v7::print<char[2],,char>
              ((basic_ostream<char,_std::char_traits<char>_> *)name_local,(char (*) [2])0xc9a94b);
  }
  ::fmt::v7::print<char[5],,char>
            ((basic_ostream<char,_std::char_traits<char>_> *)name_local,(char (*) [5])0xc99a98);
  end_j_4 = 0;
  sVar3 = std::vector<result,_std::allocator<result>_>::size
                    ((vector<result,_std::allocator<result>_> *)local_90);
  while( true ) {
    auVar13 = in_ZMM1._0_16_;
    auVar12 = in_ZMM0._0_16_;
    if (end_j_4 == sVar3) break;
    pvVar5 = std::vector<result,_std::allocator<result>_>::operator[]
                       ((vector<result,_std::allocator<result>_> *)local_70,end_j_4);
    auVar12 = vcvtusi2sd_avx512f(auVar12,pvVar5->rank);
    sVar8 = std::vector<bench::model,_std::allocator<bench::model>_>::size(&this->models);
    auVar13 = vcvtusi2sd_avx512f(auVar13,sVar8);
    in_ZMM1 = ZEXT1664(auVar13);
    dVar11 = auVar12._0_8_ / auVar13._0_8_;
    pvVar5 = std::vector<result,_std::allocator<result>_>::operator[]
                       ((vector<result,_std::allocator<result>_> *)local_70,end_j_4);
    in_ZMM0 = ZEXT864((ulong)dVar11);
    pvVar5->value = dVar11;
    pvVar5 = std::vector<result,_std::allocator<result>_>::operator[]
                       ((vector<result,_std::allocator<result>_> *)local_70,end_j_4);
    psVar2 = name_local;
    pvVar5->position = end_j_4;
    pvVar5 = std::vector<result,_std::allocator<result>_>::operator[]
                       ((vector<result,_std::allocator<result>_> *)local_70,end_j_4);
    ::fmt::v7::print<char[4],double&,char>
              ((basic_ostream<char,_std::char_traits<char>_> *)psVar2,(char (*) [4])",{}",
               &pvVar5->value);
    end_j_4 = end_j_4 + 1;
  }
  ::fmt::v7::print<char[2],,char>
            ((basic_ostream<char,_std::char_traits<char>_> *)name_local,(char (*) [2])0xc9a94b);
  iVar9 = std::begin<std::vector<result,std::allocator<result>>>
                    ((vector<result,_std::allocator<result>_> *)local_70);
  iVar10 = std::end<std::vector<result,std::allocator<result>>>
                     ((vector<result,_std::allocator<result>_> *)local_70);
  std::
  sort<__gnu_cxx::__normal_iterator<result*,std::vector<result,std::allocator<result>>>,bench::save_stats(std::ostream&,std::__cxx11::string,std::vector<bench::element,std::allocator<bench::element>>const&)::_lambda(auto:1_const&,auto:2_const&)_2_>
            (iVar9._M_current,iVar10._M_current);
  i_1 = 1;
  pvVar5 = std::vector<result,_std::allocator<result>_>::operator[]
                     ((vector<result,_std::allocator<result>_> *)local_70,0);
  pvVar5->rank = 1;
  e_1 = 1;
  sVar3 = std::vector<result,_std::allocator<result>_>::size
                    ((vector<result,_std::allocator<result>_> *)local_70);
  for (; e_1 != sVar3; e_1 = e_1 + 1) {
    pvVar5 = std::vector<result,_std::allocator<result>_>::operator[]
                       ((vector<result,_std::allocator<result>_> *)local_70,e_1);
    dVar11 = pvVar5->value;
    pvVar5 = std::vector<result,_std::allocator<result>_>::operator[]
                       ((vector<result,_std::allocator<result>_> *)local_70,e_1 - 1);
    if ((dVar11 != pvVar5->value) || (NAN(dVar11) || NAN(pvVar5->value))) {
      i_1 = i_1 + 1;
    }
    pvVar5 = std::vector<result,_std::allocator<result>_>::operator[]
                       ((vector<result,_std::allocator<result>_> *)local_70,e_1);
    pvVar5->rank = i_1;
  }
  iVar9 = std::begin<std::vector<result,std::allocator<result>>>
                    ((vector<result,_std::allocator<result>_> *)local_70);
  iVar10 = std::end<std::vector<result,std::allocator<result>>>
                     ((vector<result,_std::allocator<result>_> *)local_70);
  std::
  sort<__gnu_cxx::__normal_iterator<result*,std::vector<result,std::allocator<result>>>,bench::save_stats(std::ostream&,std::__cxx11::string,std::vector<bench::element,std::allocator<bench::element>>const&)::_lambda(auto:1_const&,auto:2_const&)_3_>
            (iVar9._M_current,iVar10._M_current);
  ::fmt::v7::print<char[5],,char>
            ((basic_ostream<char,_std::char_traits<char>_> *)name_local,(char (*) [5])"rank");
  e_2 = 0;
  sVar3 = std::vector<result,_std::allocator<result>_>::size
                    ((vector<result,_std::allocator<result>_> *)local_70);
  for (; psVar2 = name_local, e_2 != sVar3; e_2 = e_2 + 1) {
    pvVar5 = std::vector<result,_std::allocator<result>_>::operator[]
                       ((vector<result,_std::allocator<result>_> *)local_70,e_2);
    ::fmt::v7::print<char[4],unsigned_long&,char>
              ((basic_ostream<char,_std::char_traits<char>_> *)psVar2,(char (*) [4])",{}",
               &pvVar5->rank);
  }
  ::fmt::v7::print<char[2],,char>
            ((basic_ostream<char,_std::char_traits<char>_> *)name_local,(char (*) [2])0xc9a94b);
  std::vector<result,_std::allocator<result>_>::~vector
            ((vector<result,_std::allocator<result>_> *)local_90);
  std::vector<result,_std::allocator<result>_>::~vector
            ((vector<result,_std::allocator<result>_> *)local_70);
  return;
}

Assistant:

void save_stats(std::ostream& os,
                    std::string name,
                    const std::vector<element>& c)
    {
        save_header(os, name);

        std::vector<result> stats(solvers.size() + 1);
        std::vector<result> line(solvers.size() + 1);

        for (size_t i{ 0 }, e{ models.size() }; i != e; ++i) {
            for (size_t j{ 0 }, end_j{ line.size() }; j != end_j; ++j)
                line[j] = { array(i, j), j };
            line[solvers.size()] = { c[i].solution, solvers.size() };

            sort_on_value(
              std::begin(line), std::end(line), models[i].objective_type());

            size_t rank = 1;
            line[0].rank = rank;

            // values: 7 7 9 10 11 11
            // ranks:  1 1 2  3  4  4
            // but maybe we want:
            // ranks:  1 1 3  4  5  5

            for (size_t j = { 1 }, end_j{ line.size() }; j != end_j; ++j) {
                if (line[j].value != line[j - 1].value)
                    ++rank;

                line[j].rank = rank;
            }

            for (size_t j{ 0 }, end_j{ line.size() }; j != end_j; ++j)
                stats[line[j].position].rank += line[j].rank;

            std::sort(std::begin(line),
                      std::end(line),
                      [](const auto& lhs, const auto& rhs) {
                          return lhs.position < rhs.position;
                      });

            fmt::print(os, "{}", models[i].name());
            for (size_t j{ 0 }, end_j{ line.size() }; j != end_j; ++j)
                fmt::print(os, ",{}", line[j].rank);
            fmt::print(os, "\n");
        }

        fmt::print(os, "mean");
        for (size_t j{ 0 }, end_j{ line.size() }; j != end_j; ++j) {
            stats[j].value = static_cast<double>(stats[j].rank) /
                             static_cast<double>(models.size());
            stats[j].position = j;

            fmt::print(os, ",{}", stats[j].value);
        }
        fmt::print(os, "\n");

        std::sort(std::begin(stats),
                  std::end(stats),
                  [](const auto& lhs, const auto& rhs) {
                      return lhs.value < rhs.value;
                  });

        size_t rank = 1;
        stats[0].rank = rank;

        for (size_t i{ 1 }, e = stats.size(); i != e; ++i) {
            if (stats[i].value != stats[i - 1].value)
                ++rank;

            stats[i].rank = rank;
        }

        std::sort(std::begin(stats),
                  std::end(stats),
                  [](const auto& lhs, const auto& rhs) {
                      return lhs.position < rhs.position;
                  });

        fmt::print(os, "rank");
        for (size_t i{ 0 }, e = stats.size(); i != e; ++i)
            fmt::print(os, ",{}", stats[i].rank);
        fmt::print(os, "\n");
    }